

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.H
# Opt level: O3

void __thiscall Fl_Window::border(Fl_Window *this,int b)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar3;
  int iVar4;
  Fl_Widget *pFVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  Fl_Window *pFVar11;
  byte *pbVar12;
  undefined8 uVar13;
  int iVar14;
  Fl_X *pFVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  undefined8 uStack_18;
  
  uVar9 = (this->super_Fl_Group).super_Fl_Widget.flags_;
  if (b == 0) {
    if ((uVar9 & 8) != 0) {
      return;
    }
    uVar9 = uVar9 | 8;
  }
  else {
    if ((uVar9 & 8) == 0) {
      return;
    }
    uVar9 = uVar9 & 0xfffffff7;
  }
  (this->super_Fl_Group).super_Fl_Widget.flags_ = uVar9;
  auVar8 = _DAT_0021d9f0;
  pFVar15 = this->i;
  if (pFVar15 == (Fl_X *)0x0) {
    return;
  }
  pFVar11 = pFVar15->w;
  if ((pFVar11->super_Fl_Group).super_Fl_Widget.parent_ == (Fl_Group *)0x0) {
    while (((pFVar11->super_Fl_Group).super_Fl_Widget.flags_ & 0x100) == 0) {
      if (pFVar11->size_range_set != '\0') {
        pbVar12 = (byte *)XAllocSizeHints();
        pFVar11 = pFVar15->w;
        iVar4 = pFVar11->minw;
        *(int *)(pbVar12 + 0x18) = iVar4;
        iVar10 = pFVar11->minh;
        iVar6 = pFVar11->maxw;
        iVar14 = pFVar11->maxh;
        iVar7 = pFVar11->dw;
        *(int *)(pbVar12 + 0x1c) = iVar10;
        *(int *)(pbVar12 + 0x20) = iVar6;
        *(int *)(pbVar12 + 0x24) = iVar14;
        *(int *)(pbVar12 + 0x28) = iVar7;
        *(int *)(pbVar12 + 0x2c) = pFVar11->dh;
        pbVar12[0x48] = 10;
        pbVar12[0x49] = 0;
        pbVar12[0x4a] = 0;
        pbVar12[0x4b] = 0;
        uStack_38 = 0;
        uStack_20 = 0;
        uStack_18 = 0;
        uStack_30 = 1;
        uStack_28 = 1;
        if (iVar10 == iVar14 && iVar4 == iVar6) {
          pbVar12[0] = 0x30;
          pbVar12[1] = 2;
          pbVar12[2] = 0;
          pbVar12[3] = 0;
          pbVar12[4] = 0;
          pbVar12[5] = 0;
          pbVar12[6] = 0;
          pbVar12[7] = 0;
          uStack_38 = 1;
          uStack_30 = 0x13;
          pFVar11 = pFVar15->w;
          uVar13 = 3;
          goto LAB_001e4a27;
        }
        pbVar12[0] = 0x10;
        pbVar12[1] = 2;
        pbVar12[2] = 0;
        pbVar12[3] = 0;
        pbVar12[4] = 0;
        pbVar12[5] = 0;
        pbVar12[6] = 0;
        pbVar12[7] = 0;
        if (iVar6 < iVar4) {
          if (iVar10 <= iVar14) {
            pbVar12[0] = 0x30;
            pbVar12[1] = 2;
            pbVar12[2] = 0;
            pbVar12[3] = 0;
            pbVar12[4] = 0;
            pbVar12[5] = 0;
            pbVar12[6] = 0;
            pbVar12[7] = 0;
            if (fl_workarea_xywh[0] < 0) {
              fl_init_workarea();
              iVar10 = *(int *)(pbVar12 + 0x1c);
              iVar14 = *(int *)(pbVar12 + 0x24);
            }
            *(int *)(pbVar12 + 0x20) = fl_workarea_xywh[2];
            goto LAB_001e49d2;
          }
        }
        else {
          pbVar12[0] = 0x30;
          pbVar12[1] = 2;
          pbVar12[2] = 0;
          pbVar12[3] = 0;
          pbVar12[4] = 0;
          pbVar12[5] = 0;
          pbVar12[6] = 0;
          pbVar12[7] = 0;
LAB_001e49d2:
          if (iVar14 < iVar10) {
            if (fl_workarea_xywh[0] < 0) {
              fl_init_workarea();
            }
            *(int *)(pbVar12 + 0x24) = fl_workarea_xywh[3];
          }
        }
        if ((*(int *)(pbVar12 + 0x28) != 0) && (*(int *)(pbVar12 + 0x2c) != 0)) {
          *pbVar12 = *pbVar12 | 0x40;
        }
        pFVar11 = pFVar15->w;
        uVar13 = 2;
        if (pFVar11->aspect != 0) {
          *(undefined4 *)(pbVar12 + 0x30) = *(undefined4 *)(pbVar12 + 0x18);
          *(undefined4 *)(pbVar12 + 0x34) = *(undefined4 *)(pbVar12 + 0x1c);
          *(undefined4 *)(pbVar12 + 0x38) = *(undefined4 *)(pbVar12 + 0x18);
          *(undefined4 *)(pbVar12 + 0x3c) = *(undefined4 *)(pbVar12 + 0x1c);
          *pbVar12 = *pbVar12 | 0x80;
        }
LAB_001e4a27:
        uVar9 = (pFVar11->super_Fl_Group).super_Fl_Widget.flags_;
        if ((uVar9 & 0x10) != 0) {
          *pbVar12 = *pbVar12 | 1;
          *(undefined8 *)(pbVar12 + 8) =
               *(undefined8 *)&(pFVar11->super_Fl_Group).super_Fl_Widget.x_;
        }
        if ((uVar9 & 8) != 0) {
          uStack_28 = 0;
          uStack_38 = uVar13;
        }
        XSetWMNormalHints(fl_display,pFVar15->xid,pbVar12);
        XChangeProperty(fl_display,pFVar15->xid,fl_MOTIF_WM_HINTS,fl_MOTIF_WM_HINTS,0x20,0,
                        &uStack_38,5);
        XFree(pbVar12);
        return;
      }
      pFVar5 = (pFVar11->super_Fl_Group).resizable_;
      if (pFVar5 == (Fl_Widget *)0x0) {
        iVar4 = (pFVar11->super_Fl_Group).super_Fl_Widget.w_;
        iVar10 = (pFVar11->super_Fl_Group).super_Fl_Widget.h_;
        pFVar11->minw = iVar4;
        pFVar11->minh = iVar10;
        pFVar11->maxw = iVar4;
        pFVar11->maxh = iVar10;
        pFVar11->dw = 0;
        pFVar11->dh = 0;
      }
      else {
        uVar2._0_4_ = pFVar5->w_;
        uVar2._4_4_ = pFVar5->h_;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar2;
        auVar17._0_4_ = -(uint)((int)(undefined4)uVar2 < auVar8._0_4_);
        auVar17._4_4_ = -(uint)((int)uVar2._4_4_ < auVar8._4_4_);
        auVar17._8_4_ = -(uint)(0 < auVar8._8_4_);
        auVar17._12_4_ = -(uint)(0 < auVar8._12_4_);
        auVar16 = ~auVar17 & auVar8 | auVar16 & auVar17;
        uVar1 = (pFVar11->super_Fl_Group).super_Fl_Widget.w_;
        uVar3 = (pFVar11->super_Fl_Group).super_Fl_Widget.h_;
        pFVar11->minw = (auVar16._0_4_ - (undefined4)uVar2) + uVar1;
        pFVar11->minh = (auVar16._4_4_ - uVar2._4_4_) + uVar3;
        pFVar11->maxw = 0;
        pFVar11->maxh = 0;
        pFVar11->dw = 0;
        pFVar11->dh = 0;
      }
      pFVar11->aspect = 0;
      pFVar11->size_range_set = '\x01';
      pFVar15 = pFVar11->i;
      if (pFVar15 == (Fl_X *)0x0) {
        return;
      }
      pFVar11 = pFVar15->w;
      if ((pFVar11->super_Fl_Group).super_Fl_Widget.parent_ != (Fl_Group *)0x0) {
        return;
      }
    }
  }
  return;
}

Assistant:

unsigned int flags() const {return flags_;}